

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

bool BicTest3<Blob<128>,unsigned_long>(pfHash hash,int reps,bool verbose)

{
  ulong uVar1;
  int *piVar2;
  int b;
  void *__s;
  ulong uVar3;
  long lVar4;
  uint32_t bit;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int keybit;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined8 in_XMM7_Qb;
  unsigned_long h2;
  unsigned_long h1;
  Blob<128> key;
  uint local_a0;
  uint local_9c;
  ulong local_68;
  ulong local_60;
  Rand local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58.x = 0x88e23b73;
  local_58.y = 0x11310f6c;
  local_58.z = 0x18847f4;
  local_58.w = 0x1142a2ba;
  local_48 = 0;
  uStack_40 = 0;
  __s = operator_new(0x800000);
  lVar5 = 0;
  memset(__s,0,0x800000);
  lVar9 = (long)__s + 0x10;
  do {
    bit = (uint32_t)lVar5;
    if ((bit * -0x55555555 >> 2 | bit * -0x40000000) < 0x15555556) {
      putchar(0x2e);
    }
    if (0 < reps) {
      iVar11 = 0;
      do {
        Rand::rand_p(&local_58,&local_48,0x10);
        (*hash)(&local_48,0x10,0,&local_60);
        flipbit(&local_48,0x10,bit);
        (*hash)(&local_48,0x10,0,&local_68);
        uVar3 = 1;
        uVar6 = 0;
        lVar4 = lVar9;
        do {
          uVar8 = uVar6 & 0x3f;
          uVar6 = uVar6 + 1;
          lVar7 = lVar4 + (ulong)((uint)((local_68 ^ local_60) >> uVar8) & 1) * 4;
          uVar8 = uVar3;
          do {
            piVar2 = (int *)(lVar7 + (ulong)((uint)((local_68 ^ local_60) >> (uVar8 & 0x3f)) & 1) *
                                     8);
            *piVar2 = *piVar2 + 1;
            uVar8 = uVar8 + 1;
            lVar7 = lVar7 + 0x10;
          } while (uVar8 != 0x40);
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x410;
        } while (uVar6 != 0x3f);
        iVar11 = iVar11 + 1;
      } while (iVar11 != reps);
    }
    lVar5 = lVar5 + 1;
    lVar9 = lVar9 + 0x10000;
  } while (lVar5 != 0x80);
  putchar(10);
  lVar9 = (long)__s + 0x10;
  auVar13 = ZEXT864(0) << 0x40;
  uVar6 = 1;
  auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar8 = 0;
  local_a0 = 0;
  local_9c = 0;
  uVar3 = 0;
  do {
    uVar1 = uVar3 + 1;
    uVar12 = uVar6;
    lVar5 = lVar9;
    do {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar3 & 0xffffffff,uVar12 & 0xffffffff);
        auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar13 = ZEXT864(auVar13._0_8_);
      }
      uVar10 = 0;
      lVar4 = lVar5;
      do {
        auVar16 = ZEXT864(0) << 0x40;
        lVar7 = 0;
        do {
          auVar14._0_8_ = (double)*(int *)(lVar4 + lVar7 * 4) / (double)(reps / 2);
          auVar14._8_8_ = in_XMM7_Qb;
          auVar14 = vfmadd213sd_fma(auVar14,auVar17._0_16_,auVar18._0_16_);
          auVar14 = vandpd_avx(auVar14,auVar19._0_16_);
          auVar14 = vmaxsd_avx(auVar14,auVar16._0_16_);
          auVar16 = ZEXT1664(auVar14);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        dVar15 = auVar14._0_8_;
        if (auVar13._0_8_ < dVar15) {
          uVar8 = uVar10 & 0xffffffff;
          auVar13 = ZEXT1664(auVar14);
          local_a0 = (uint)uVar3;
          local_9c = (uint)uVar12;
        }
        if (verbose) {
          iVar11 = 0x2e;
          if ((0.01 <= dVar15) && (iVar11 = 0x6f, 0.05 <= dVar15)) {
            iVar11 = (uint)(0.33 <= dVar15) * 9 + 0x4f;
          }
          putchar(iVar11);
          auVar13 = ZEXT864(auVar13._0_8_);
          auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
        uVar10 = uVar10 + 1;
        lVar4 = lVar4 + 0x10000;
      } while (uVar10 != 0x80);
      if (verbose) {
        putchar(10);
        auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar13 = ZEXT864(auVar13._0_8_);
      }
      uVar12 = uVar12 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar12 != 0x40);
    if (verbose) {
      iVar11 = 0x8c;
      do {
        putchar(0x2d);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      putchar(10);
      auVar13 = ZEXT864(auVar13._0_8_);
      auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar6 = uVar6 + 1;
    lVar9 = lVar9 + 0x410;
    uVar3 = uVar1;
  } while (uVar1 != 0x3f);
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar8,(ulong)local_a0,(ulong)local_9c);
  operator_delete(__s);
  return auVar13._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}